

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

char __thiscall
Fl_Preferences::get(Fl_Preferences *this,char *key,void *data,void *defaultValue,int defaultSize,
                   int maxSize)

{
  Node *this_00;
  char *src;
  char cVar1;
  uint uVar2;
  void *__src;
  int dsize;
  int local_2c;
  
  this_00 = this->node;
  uVar2 = Node::getEntry(this_00,key);
  if (((int)uVar2 < 0) || (src = this_00->entry_[uVar2].value, src == (char *)0x0)) {
    if (defaultValue != (void *)0x0) {
      if (defaultSize < maxSize) {
        maxSize = defaultSize;
      }
      memmove(data,defaultValue,(long)maxSize);
    }
    cVar1 = '\0';
  }
  else {
    __src = decodeHex(src,&local_2c);
    if (local_2c < maxSize) {
      maxSize = local_2c;
    }
    memcpy(data,__src,(long)maxSize);
    free(__src);
    cVar1 = '\x01';
  }
  return cVar1;
}

Assistant:

char Fl_Preferences::get( const char *key, void *data, const void *defaultValue, int defaultSize, int maxSize ) {
  const char *v = node->get( key );
  if ( v ) {
    int dsize;
    void *w = decodeHex( v, dsize );
    memmove( data, w, dsize>maxSize?maxSize:dsize );
    free( w );
    return 1;
  }
  if ( defaultValue )
    memmove( data, defaultValue, defaultSize>maxSize?maxSize:defaultSize );
  return 0;
}